

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O3

int __thiscall TiXmlElement::QueryUnsignedAttribute(TiXmlElement *this,char *name,uint *value)

{
  int iVar1;
  ulong in_RAX;
  TiXmlAttribute *pTVar2;
  int ival;
  undefined8 uStack_28;
  
  pTVar2 = &(this->attributeSet).sentinel;
  uStack_28 = in_RAX;
  do {
    pTVar2 = pTVar2->next;
    if (pTVar2 == &(this->attributeSet).sentinel) {
      return 1;
    }
    iVar1 = strcmp(((pTVar2->name).rep_)->str,name);
  } while (iVar1 != 0);
  uStack_28 = uStack_28 & 0xffffffff;
  iVar1 = __isoc99_sscanf(((pTVar2->value).rep_)->str,"%d",(long)&uStack_28 + 4);
  *value = uStack_28._4_4_;
  return (uint)(iVar1 != 1) * 2;
}

Assistant:

int TiXmlElement::QueryUnsignedAttribute( const char* name, unsigned* value ) const
{
	const TiXmlAttribute* node = attributeSet.Find( name );
	if ( !node )
		return TIXML_NO_ATTRIBUTE;

	int ival = 0;
	int result = node->QueryIntValue( &ival );
	*value = (unsigned)ival;
	return result;
}